

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.h
# Opt level: O0

PropertySymbol * __thiscall slang::ast::Symbol::as<slang::ast::PropertySymbol>(Symbol *this)

{
  bool bVar1;
  Symbol *this_local;
  
  bVar1 = PropertySymbol::isKind(this->kind);
  if (!bVar1) {
    assert::assertFailed
              ("T::isKind(kind)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
               ,0xc4,"decltype(auto) slang::ast::Symbol::as() [T = slang::ast::PropertySymbol]");
  }
  return (PropertySymbol *)this;
}

Assistant:

decltype(auto) as() {
        if constexpr (std::is_same_v<T, Scope>) {
            const Scope* scope = scopeOrNull();
            ASSERT(scope);
            return *scope;
        }
        else {
            ASSERT(T::isKind(kind));
            return *static_cast<T*>(this);
        }
    }